

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O3

size_t mp_vformat(char *data,size_t data_size,char *format,__va_list_tag *vl)

{
  byte bVar1;
  char *__s;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  double *pdVar5;
  uint *puVar6;
  size_t sVar7;
  long lVar8;
  ulong *puVar9;
  uint uVar10;
  undefined8 *puVar11;
  int iVar12;
  byte *pbVar13;
  int64_t k;
  void *__src;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  size_t sVar17;
  float fVar18;
  byte *local_38;
  
  sVar17 = 0;
LAB_0013c9c9:
  bVar1 = *format;
  pbVar13 = (byte *)format;
  if (0x5a < bVar1) {
    if (bVar1 == 0x5b) {
      iVar12 = 1;
      uVar2 = 0;
      pbVar14 = (byte *)format;
      do {
        pbVar15 = pbVar14 + 1;
        bVar1 = pbVar14[1];
        if (bVar1 < 0x5d) {
          if (bVar1 < 0x4e) {
            if (bVar1 == 0x25) {
              if (pbVar14[2] != 0x25) {
                bVar16 = iVar12 == 1;
                goto LAB_0013cbb2;
              }
              pbVar15 = pbVar14 + 2;
            }
            else if (bVar1 == 0) {
              __assert_fail("level == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                            ,0x71,
                            "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                           );
            }
          }
          else if (bVar1 == 0x4e) {
            if (pbVar14[2] == 0x49) {
              bVar16 = iVar12 == 1 && pbVar14[3] == 0x4c;
LAB_0013cbb2:
              uVar2 = uVar2 + bVar16;
            }
          }
          else if (bVar1 == 0x5b) goto LAB_0013cb61;
        }
        else if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
          iVar12 = iVar12 + -1;
          if (iVar12 == 0) {
            if (bVar1 != 0x5d) {
              __assert_fail("level || *e == \']\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                            ,0x65,
                            "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                           );
            }
            break;
          }
        }
        else if (bVar1 == 0x7b) {
LAB_0013cb61:
          uVar2 = uVar2 + (iVar12 == 1);
          iVar12 = iVar12 + 1;
        }
        pbVar14 = pbVar15;
      } while (iVar12 != 0);
      lVar8 = (ulong)(0xffff < uVar2) * 2 + 3;
      if (uVar2 < 0x10) {
        lVar8 = 1;
      }
      sVar17 = lVar8 + sVar17;
      if (sVar17 <= data_size) {
        if (uVar2 < 0x10) {
          *data = (byte)uVar2 | 0x90;
LAB_0013cc73:
          lVar8 = 1;
        }
        else {
          if (uVar2 < 0x10000) {
            *data = 0xdc;
            *(ushort *)((byte *)data + 1) = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
            goto LAB_0013cc95;
          }
          *data = 0xdd;
          *(uint *)((byte *)data + 1) =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
LAB_0013cd1a:
          lVar8 = 5;
        }
LAB_0013cd1f:
        data = (char *)((byte *)data + lVar8);
      }
    }
    else if (bVar1 == 0x7b) {
      iVar12 = 1;
      uVar2 = 0;
      pbVar14 = (byte *)format;
      do {
        pbVar15 = pbVar14 + 1;
        bVar1 = pbVar14[1];
        if (bVar1 < 0x5d) {
          if (bVar1 < 0x4e) {
            if (bVar1 == 0x25) {
              if (pbVar14[2] != 0x25) {
                bVar16 = iVar12 == 1;
                goto LAB_0013cabb;
              }
              pbVar15 = pbVar14 + 2;
            }
            else if (bVar1 == 0) {
              __assert_fail("level == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                            ,0x8e,
                            "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                           );
            }
          }
          else if (bVar1 == 0x4e) {
            if (pbVar14[2] == 0x49) {
              bVar16 = iVar12 == 1 && pbVar14[3] == 0x4c;
LAB_0013cabb:
              uVar2 = uVar2 + bVar16;
            }
          }
          else if (bVar1 == 0x5b) goto LAB_0013ca67;
        }
        else if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
          iVar12 = iVar12 + -1;
          if (iVar12 == 0) {
            if (bVar1 != 0x7d) {
              __assert_fail("level || *e == \'}\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                            ,0x82,
                            "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)"
                           );
            }
            break;
          }
        }
        else if (bVar1 == 0x7b) {
LAB_0013ca67:
          uVar2 = uVar2 + (iVar12 == 1);
          iVar12 = iVar12 + 1;
        }
        pbVar14 = pbVar15;
      } while (iVar12 != 0);
      if ((uVar2 & 1) != 0) {
        __assert_fail("count % 2 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0x90,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      lVar8 = (ulong)(0x1ffff < uVar2) * 2 + 3;
      if (uVar2 < 0x20) {
        lVar8 = 1;
      }
      sVar17 = lVar8 + sVar17;
      if (sVar17 <= data_size) {
        uVar10 = uVar2 >> 1;
        if (uVar2 < 0x20) {
          *data = (byte)uVar10 | 0x80;
          goto LAB_0013cc73;
        }
        if (0x1ffff < uVar2) {
          *data = 0xdf;
          *(uint *)((byte *)data + 1) =
               uVar2 >> 0x19 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
          goto LAB_0013cd1a;
        }
        *data = 0xde;
        *(ushort *)((byte *)data + 1) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
LAB_0013cc95:
        lVar8 = 3;
        goto LAB_0013cd1f;
      }
    }
    goto LAB_0013cd25;
  }
  if (bVar1 != 0x25) {
    if (bVar1 == 0x4e) {
      if ((((byte *)format)[1] == 0x49) && (((byte *)format)[2] == 0x4c)) {
        sVar17 = sVar17 + 1;
        pbVar13 = (byte *)format + 2;
        if (sVar17 <= data_size) {
          *data = 0xc0;
          data = (char *)((byte *)data + 1);
        }
      }
    }
    else if (bVar1 == 0) {
      return sVar17;
    }
    goto LAB_0013cd25;
  }
  pbVar13 = (byte *)format + 1;
  bVar1 = ((byte *)format)[1];
  if (bVar1 < 0x62) {
    if (bVar1 == 0x25) goto LAB_0013cd25;
    if (bVar1 != 0x2e) {
      if (bVar1 == 0) {
        __assert_fail("f[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0x97,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      goto switchD_0013cafb_caseD_63;
    }
    if (((byte *)format)[2] != 0x2a) goto switchD_0013cafb_caseD_63;
    pbVar13 = (byte *)format + 3;
    if (((byte *)format)[3] != 0x73) {
      if (((byte *)format)[3] != 0x70) goto switchD_0013cafb_caseD_63;
      uVar2 = vl->gp_offset;
      uVar4 = (ulong)uVar2;
      if (uVar4 < 0x29) {
        vl->gp_offset = (uint)(uVar4 + 8);
        uVar10 = *(uint *)((long)vl->reg_save_area + uVar4);
        if (0x20 < uVar2) goto LAB_0013d1e6;
        puVar11 = (undefined8 *)(uVar4 + 8 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar6 = (uint *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar6 + 2;
        uVar10 = *puVar6;
LAB_0013d1e6:
        puVar11 = (undefined8 *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar11 + 1;
      }
      if (uVar10 == 0) {
        __assert_fail("len > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c"
                      ,0xbb,
                      "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
      }
      uVar4 = (ulong)uVar10;
      sVar17 = sVar17 + uVar4;
      if (sVar17 <= data_size) {
        memcpy(data,(void *)*puVar11,uVar4);
        data = (char *)((byte *)data + uVar4);
      }
      goto LAB_0013cd25;
    }
    uVar2 = vl->gp_offset;
    uVar4 = (ulong)uVar2;
    if (uVar4 < 0x29) {
      vl->gp_offset = (uint)(uVar4 + 8);
      uVar10 = *(uint *)((long)vl->reg_save_area + uVar4);
      if (0x20 < uVar2) goto LAB_0013d173;
      puVar11 = (undefined8 *)(uVar4 + 8 + (long)vl->reg_save_area);
      vl->gp_offset = uVar2 + 0x10;
    }
    else {
      puVar6 = (uint *)vl->overflow_arg_area;
      vl->overflow_arg_area = puVar6 + 2;
      uVar10 = *puVar6;
LAB_0013d173:
      puVar11 = (undefined8 *)vl->overflow_arg_area;
      vl->overflow_arg_area = puVar11 + 1;
    }
    uVar4 = (ulong)uVar10;
    if (uVar10 < 0x20) {
      sVar17 = sVar17 + uVar4 + 1;
      if (sVar17 <= data_size) {
        __src = (void *)*puVar11;
        *data = (byte)uVar10 | 0xa0;
        lVar8 = 1;
LAB_0013d4e5:
        memcpy((byte *)data + lVar8,__src,uVar4);
        data = (char *)((byte *)data + lVar8 + uVar4);
      }
    }
    else {
      iVar12 = (0xffff < uVar10) + 3 + (uint)(0xffff < uVar10);
      if (uVar10 < 0x100) {
        iVar12 = 2;
      }
      sVar17 = sVar17 + (iVar12 + uVar10);
      if (sVar17 <= data_size) {
        __src = (void *)*puVar11;
        if (uVar10 < 0x100) {
          *data = 0xd9;
          ((byte *)data)[1] = (byte)uVar10;
          lVar8 = 2;
        }
        else if (uVar10 < 0x10000) {
          *data = 0xda;
          *(ushort *)((byte *)data + 1) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
          lVar8 = 3;
        }
        else {
          *data = 0xdb;
          *(uint *)((byte *)data + 1) =
               uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
          lVar8 = 5;
        }
        goto LAB_0013d4e5;
      }
    }
    goto LAB_0013cd25;
  }
  switch(bVar1) {
  case 0x62:
    uVar2 = vl->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar3 = (int *)((ulong)uVar2 + (long)vl->reg_save_area);
      vl->gp_offset = uVar2 + 8;
    }
    else {
      piVar3 = (int *)vl->overflow_arg_area;
      vl->overflow_arg_area = piVar3 + 2;
    }
    sVar17 = sVar17 + 1;
    if (sVar17 <= data_size) {
      *data = *piVar3 != 0 | 0xc2;
      data = (char *)((byte *)data + 1);
    }
    break;
  default:
switchD_0013cafb_caseD_63:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.c",
                  0xf8,"size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
  case 100:
  case 0x69:
    goto switchD_0013cafb_caseD_64;
  case 0x66:
    uVar2 = vl->fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar5 = (double *)((ulong)uVar2 + (long)vl->reg_save_area);
      vl->fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar5 = (double *)vl->overflow_arg_area;
      vl->overflow_arg_area = pdVar5 + 1;
    }
    sVar17 = sVar17 + 5;
    if (sVar17 <= data_size) {
      fVar18 = (float)*pdVar5;
      *data = 0xca;
      *(uint *)((byte *)data + 1) =
           (uint)fVar18 >> 0x18 | ((uint)fVar18 & 0xff0000) >> 8 | ((uint)fVar18 & 0xff00) << 8 |
           (int)fVar18 << 0x18;
      data = (char *)((byte *)data + 5);
    }
    break;
  case 0x68:
    pbVar13 = (byte *)format + 2;
    bVar1 = ((byte *)format)[2];
    if (bVar1 < 0x69) {
      if (bVar1 != 100) {
        if (bVar1 != 0x68) goto switchD_0013cafb_caseD_63;
        if ((((byte *)format)[3] != 0x69) && (((byte *)format)[3] != 100)) {
          if (((byte *)format)[3] != 0x75) goto switchD_0013cafb_caseD_63;
          uVar2 = vl->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar6 = (uint *)((ulong)uVar2 + (long)vl->reg_save_area);
            vl->gp_offset = uVar2 + 8;
          }
          else {
            puVar6 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar6 + 2;
          }
          uVar4 = (ulong)*puVar6;
          goto LAB_0013d4ce;
        }
        uVar2 = vl->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar3 = (int *)((ulong)uVar2 + (long)vl->reg_save_area);
          vl->gp_offset = uVar2 + 8;
        }
        else {
          piVar3 = (int *)vl->overflow_arg_area;
          vl->overflow_arg_area = piVar3 + 2;
        }
        uVar4 = (ulong)*piVar3;
LAB_0013d3f6:
        pbVar13 = (byte *)format + 3;
        goto LAB_0013cd44;
      }
    }
    else {
      if (bVar1 == 0x75) goto switchD_0013cafb_caseD_75;
      if (bVar1 != 0x69) goto switchD_0013cafb_caseD_63;
    }
    goto switchD_0013cafb_caseD_64;
  case 0x6c:
    pbVar13 = (byte *)format + 2;
    switch(((byte *)format)[2]) {
    case 100:
    case 0x69:
      uVar2 = vl->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (ulong *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (ulong *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar9 + 1;
      }
      uVar4 = *puVar9;
      goto LAB_0013cd44;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
      goto switchD_0013cafb_caseD_63;
    case 0x66:
      uVar2 = vl->fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        puVar9 = (ulong *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->fp_offset = uVar2 + 0x10;
      }
      else {
        puVar9 = (ulong *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar9 + 1;
      }
      sVar17 = sVar17 + 9;
      if (sVar17 <= data_size) {
        uVar4 = *puVar9;
        *data = 0xcb;
        *(ulong *)((byte *)data + 1) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        data = (char *)((byte *)data + 9);
      }
      goto LAB_0013cd25;
    case 0x6c:
      if ((((byte *)format)[3] == 0x69) || (((byte *)format)[3] == 100)) {
        uVar2 = vl->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar9 = (ulong *)((ulong)uVar2 + (long)vl->reg_save_area);
          vl->gp_offset = uVar2 + 8;
        }
        else {
          puVar9 = (ulong *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar9 + 1;
        }
        uVar4 = *puVar9;
        goto LAB_0013d3f6;
      }
      if (((byte *)format)[3] != 0x75) goto switchD_0013cafb_caseD_63;
      uVar2 = vl->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (ulong *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (ulong *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar9 + 1;
      }
      uVar4 = *puVar9;
LAB_0013d4ce:
      pbVar13 = (byte *)format + 3;
      break;
    default:
      if (((byte *)format)[2] != 0x75) goto switchD_0013cafb_caseD_63;
      uVar2 = vl->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar9 = (ulong *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 8;
      }
      else {
        puVar9 = (ulong *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar9 + 1;
      }
      uVar4 = *puVar9;
    }
    goto LAB_0013cf7f;
  case 0x70:
    uVar2 = vl->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar11 = (undefined8 *)((ulong)uVar2 + (long)vl->reg_save_area);
      vl->gp_offset = uVar2 + 8;
    }
    else {
      puVar11 = (undefined8 *)vl->overflow_arg_area;
      vl->overflow_arg_area = puVar11 + 1;
    }
    pbVar14 = (byte *)*puVar11;
    pbVar15 = pbVar14;
    k = 1;
    do {
      lVar8 = (long)""[*pbVar15];
      if (lVar8 < 0) {
        if (*pbVar15 == 0xd9) {
          pbVar15 = pbVar15 + (ulong)pbVar15[1] + 2;
        }
        else {
          if ((byte)""[*pbVar15] < 0xe1) {
            local_38 = pbVar15;
            mp_next_slowpath((char **)&local_38,k);
            pbVar15 = local_38;
            break;
          }
          k = k - lVar8;
          pbVar15 = pbVar15 + 1;
        }
      }
      else {
        pbVar15 = pbVar15 + 1 + lVar8;
      }
      bVar16 = 1 < k;
      k = k + -1;
    } while (bVar16);
    uVar4 = (ulong)(uint)((int)pbVar15 - (int)pbVar14);
    sVar17 = sVar17 + uVar4;
    if (sVar17 <= data_size) {
      memcpy(data,pbVar14,uVar4);
      data = (char *)((byte *)data + uVar4);
    }
    break;
  case 0x73:
    uVar2 = vl->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar11 = (undefined8 *)((ulong)uVar2 + (long)vl->reg_save_area);
      vl->gp_offset = uVar2 + 8;
    }
    else {
      puVar11 = (undefined8 *)vl->overflow_arg_area;
      vl->overflow_arg_area = puVar11 + 1;
    }
    __s = (char *)*puVar11;
    sVar7 = strlen(__s);
    uVar2 = (uint)sVar7;
    if (uVar2 < 0x20) {
      sVar17 = (uVar2 + 1 & 0x3f) + sVar17;
      if (sVar17 <= data_size) {
        *data = (byte)sVar7 | 0xa0;
        lVar8 = 1;
LAB_0013d43b:
        memcpy((byte *)data + lVar8,__s,sVar7 & 0xffffffff);
        data = (char *)((byte *)data + lVar8 + (sVar7 & 0xffffffff));
      }
    }
    else {
      iVar12 = (0xffff < uVar2) + 3 + (uint)(0xffff < uVar2);
      if (uVar2 < 0x100) {
        iVar12 = 2;
      }
      sVar17 = (uVar2 + iVar12) + sVar17;
      if (sVar17 <= data_size) {
        if (uVar2 < 0x100) {
          *data = 0xd9;
          ((byte *)data)[1] = (byte)sVar7;
          lVar8 = 2;
        }
        else if (uVar2 < 0x10000) {
          *data = 0xda;
          *(ushort *)((byte *)data + 1) = (ushort)sVar7 << 8 | (ushort)sVar7 >> 8;
          lVar8 = 3;
        }
        else {
          *data = 0xdb;
          *(uint *)((byte *)data + 1) =
               uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          lVar8 = 5;
        }
        goto LAB_0013d43b;
      }
    }
    break;
  case 0x75:
switchD_0013cafb_caseD_75:
    uVar2 = vl->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar6 = (uint *)((ulong)uVar2 + (long)vl->reg_save_area);
      vl->gp_offset = uVar2 + 8;
    }
    else {
      puVar6 = (uint *)vl->overflow_arg_area;
      vl->overflow_arg_area = puVar6 + 2;
    }
    uVar4 = (ulong)*puVar6;
    goto LAB_0013cf7f;
  }
LAB_0013cd25:
  format = (char *)(pbVar13 + 1);
  goto LAB_0013c9c9;
switchD_0013cafb_caseD_64:
  uVar2 = vl->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    piVar3 = (int *)((ulong)uVar2 + (long)vl->reg_save_area);
    vl->gp_offset = uVar2 + 8;
  }
  else {
    piVar3 = (int *)vl->overflow_arg_area;
    vl->overflow_arg_area = piVar3 + 2;
  }
  uVar4 = (ulong)*piVar3;
LAB_0013cd44:
  if ((long)uVar4 < 0) {
    if (uVar4 < 0xffffffffffffffe0) {
      if (uVar4 < 0xffffffffffffff80) {
        lVar8 = (ulong)(uVar4 < 0xffffffff80000000) * 4 + 5;
        if (0xffffffffffff7fff < uVar4) {
          lVar8 = 3;
        }
        sVar17 = sVar17 + lVar8;
        if (sVar17 <= data_size) {
          if (0xffffffffffffff7f < uVar4) goto LAB_0013d14e;
          if (uVar4 < 0xffffffffffff8000) {
            if (uVar4 < 0xffffffff80000000) {
              *data = 0xd3;
              goto LAB_0013d512;
            }
            *data = 0xd2;
LAB_0013d4a9:
            uVar2 = (uint)uVar4;
            *(uint *)((byte *)data + 1) =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            lVar8 = 5;
          }
          else {
            *data = 0xd1;
LAB_0013d3ce:
            *(ushort *)((byte *)data + 1) = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
            lVar8 = 3;
          }
          goto LAB_0013d15b;
        }
      }
      else {
        sVar17 = sVar17 + 2;
        if (sVar17 <= data_size) {
LAB_0013d14e:
          *data = 0xd0;
LAB_0013d152:
          ((byte *)data)[1] = (byte)uVar4;
          lVar8 = 2;
          goto LAB_0013d15b;
        }
      }
    }
    else {
LAB_0013cf87:
      sVar17 = sVar17 + 1;
      if (sVar17 <= data_size) {
        *data = (byte)uVar4;
        lVar8 = 1;
LAB_0013d15b:
        data = (char *)((byte *)data + lVar8);
      }
    }
  }
  else {
LAB_0013cf7f:
    if (uVar4 < 0x80) goto LAB_0013cf87;
    if (uVar4 < 0x100) {
      sVar17 = sVar17 + 2;
      if (sVar17 <= data_size) {
LAB_0013cff2:
        *data = 0xcc;
        goto LAB_0013d152;
      }
    }
    else {
      lVar8 = (ulong)(uVar4 >> 0x20 != 0) * 4 + 5;
      if (uVar4 < 0x10000) {
        lVar8 = 3;
      }
      sVar17 = sVar17 + lVar8;
      if (sVar17 <= data_size) {
        if (0xff < uVar4) {
          if (uVar4 < 0x10000) {
            *data = 0xcd;
            goto LAB_0013d3ce;
          }
          if (uVar4 >> 0x20 == 0) {
            *data = 0xce;
            goto LAB_0013d4a9;
          }
          *data = 0xcf;
LAB_0013d512:
          *(ulong *)((byte *)data + 1) =
               uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
          lVar8 = 9;
          goto LAB_0013d15b;
        }
        goto LAB_0013cff2;
      }
    }
  }
  goto LAB_0013cd25;
}

Assistant:

size_t
mp_vformat(char *data, size_t data_size, const char *format, va_list vl)
{
	size_t result = 0;
	const char *f = NULL;

	for (f = format; *f; f++) {
		if (f[0] == '[') {
			uint32_t size = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						size++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '[' must be closed by ']' */
					assert(level || *e == ']');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						size++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					size++;
				}
			}
			/* opened '[' must be closed */
			assert(level == 0);
			result += mp_sizeof_array(size);
			if (result <= data_size)
				data = mp_encode_array(data, size);
		} else if (f[0] == '{') {
			uint32_t count = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						count++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '{' must be closed by '}' */
					assert(level || *e == '}');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						count++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					count++;
				}
			}
			/* opened '{' must be closed */
			assert(level == 0);
			/* since map is a pair list, count must be even */
			assert(count % 2 == 0);
			uint32_t size = count / 2;
			result += mp_sizeof_map(size);
			if (result <= data_size)
				data = mp_encode_map(data, size);
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
				f += 2;
			} else if (f[0] == 'p') {
				const char *p = va_arg(vl, const char *);
				const char *end = p;
				mp_next(&end);
				uint32_t len = (uint32_t)(end - p);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 'p') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *p = va_arg(vl, const char *);
				assert(len > 0);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
				f += 2;
			} else if(f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				result += mp_sizeof_float(v);
				if (result <= data_size)
					data = mp_encode_float(data, v);
			} else if(f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				result += mp_sizeof_double(v);
				if (result <= data_size)
					data = mp_encode_double(data, v);
				f++;
			} else if(f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				result += mp_sizeof_bool(v);
				if (result <= data_size)
					data = mp_encode_bool(data, v);
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1 && int_value < 0) {
				result += mp_sizeof_int(int_value);
				if (result <= data_size)
					data = mp_encode_int(data, int_value);
			} else if(int_status) {
				result += mp_sizeof_uint(int_value);
				if (result <= data_size)
					data = mp_encode_uint(data, int_value);
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			result += mp_sizeof_nil();
			if (result <= data_size)
				data = mp_encode_nil(data);
			f += 2;
		}
	}
	return result;
}